

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

ARMVAParameters aa64_va_parameters_arm(CPUARMState *env,uint64_t va,ARMMMUIdx mmu_idx,_Bool data)

{
  uint64_t value;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  TCR *pTVar6;
  uint64_t uVar7;
  ushort local_4c;
  int local_48;
  uint local_40;
  int tg;
  int tbi;
  int tsz;
  int select;
  _Bool using64k;
  _Bool using16k;
  _Bool hpd;
  _Bool epd;
  uint64_t tcr;
  _Bool data_local;
  ARMMMUIdx mmu_idx_local;
  uint64_t va_local;
  CPUARMState *env_local;
  
  pTVar6 = regime_tcr(env,mmu_idx);
  value = pTVar6->raw_tcr;
  _Var1 = regime_has_2_ranges(mmu_idx);
  uVar3 = (uint32_t)value;
  if (_Var1) {
    uVar7 = extract64(va,0x37,1);
    tbi = (int)uVar7;
    if (tbi == 0) {
      tg = extract32(uVar3,0,6);
      uVar2 = extract32(uVar3,7,1);
      uVar4 = extract32(uVar3,0xe,1);
      tsz._0_1_ = uVar4 != 0;
      uVar3 = extract32(uVar3,0xf,1);
      tsz._1_1_ = uVar3 != 0;
      uVar7 = extract64(value,0x29,1);
    }
    else {
      uVar2 = extract32(uVar3,0x1e,2);
      tsz._1_1_ = uVar2 == 1;
      tsz._0_1_ = uVar2 == 3;
      tg = extract32(uVar3,0x10,6);
      uVar2 = extract32(uVar3,0x17,1);
      uVar7 = extract64(value,0x2a,1);
    }
    tsz._3_1_ = uVar2 != 0;
    tsz._2_1_ = uVar7 != 0;
  }
  else {
    tbi = 0;
    tg = extract32(uVar3,0,6);
    uVar2 = extract32(uVar3,0xe,1);
    tsz._0_1_ = uVar2 != 0;
    uVar2 = extract32(uVar3,0xf,1);
    tsz._1_1_ = uVar2 != 0;
    if (mmu_idx == ARMMMUIdx_Stage2) {
      tsz._2_1_ = false;
    }
    else {
      uVar3 = extract32(uVar3,0x18,1);
      tsz._2_1_ = uVar3 != 0;
    }
    tsz._3_1_ = false;
  }
  if (tg < 0x27) {
    local_48 = tg;
  }
  else {
    local_48 = 0x27;
  }
  if (local_48 < 0x11) {
    local_4c = 0x10;
  }
  else {
    local_4c = (ushort)local_48;
  }
  local_40 = aa64_va_parameter_tbi(value,mmu_idx);
  if (!data) {
    uVar5 = aa64_va_parameter_tbid(value,mmu_idx);
    local_40 = (uVar5 ^ 0xffffffff) & local_40;
  }
  env_local._4_4_ =
       (ARMVAParameters)
       CONCAT22(env_local._6_2_,
                env_local._4_2_ & 0xc000 | local_4c & 0xff | ((ushort)tbi & 1) << 8 |
                (ushort)(((int)local_40 >> ((byte)tbi & 0x1f) & 1U) != 0) << 9 |
                (ushort)tsz._3_1_ << 10 | (ushort)tsz._2_1_ << 0xb | (ushort)tsz._1_1_ << 0xc |
                (ushort)tsz._0_1_ << 0xd);
  return env_local._4_4_;
}

Assistant:

ARMVAParameters aa64_va_parameters(CPUARMState *env, uint64_t va,
                                   ARMMMUIdx mmu_idx, bool data)
{
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    bool epd, hpd, using16k, using64k;
    int select, tsz, tbi;

    if (!regime_has_2_ranges(mmu_idx)) {
        select = 0;
        tsz = extract32(tcr, 0, 6);
        using64k = extract32(tcr, 14, 1);
        using16k = extract32(tcr, 15, 1);
        if (mmu_idx == ARMMMUIdx_Stage2) {
            /* VTCR_EL2 */
            hpd = false;
        } else {
            hpd = extract32(tcr, 24, 1);
        }
        epd = false;
    } else {
        /*
         * Bit 55 is always between the two regions, and is canonical for
         * determining if address tagging is enabled.
         */
        select = extract64(va, 55, 1);
        if (!select) {
            tsz = extract32(tcr, 0, 6);
            epd = extract32(tcr, 7, 1);
            using64k = extract32(tcr, 14, 1);
            using16k = extract32(tcr, 15, 1);
            hpd = extract64(tcr, 41, 1);
        } else {
            int tg = extract32(tcr, 30, 2);
            using16k = tg == 1;
            using64k = tg == 3;
            tsz = extract32(tcr, 16, 6);
            epd = extract32(tcr, 23, 1);
            hpd = extract64(tcr, 42, 1);
        }
    }
    tsz = MIN(tsz, 39);  /* TODO: ARMv8.4-TTST */
    tsz = MAX(tsz, 16);  /* TODO: ARMv8.2-LVA  */

    /* Present TBI as a composite with TBID.  */
    tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
    if (!data) {
        tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
    }
    tbi = (tbi >> select) & 1;

    return (ARMVAParameters) {
        .tsz = tsz,
        .select = select,
        .tbi = tbi,
        .epd = epd,
        .hpd = hpd,
        .using16k = using16k,
        .using64k = using64k,
    };
}